

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp.cc
# Opt level: O3

RegExp * __thiscall re2c::Scanner::mkDot(Scanner *this)

{
  bool bVar1;
  opt_t *poVar2;
  Range *pRVar3;
  Range *r2;
  RegExp *pRVar4;
  uint32_t c;
  uint32_t local_24;
  
  poVar2 = realopt_t::operator->((realopt_t *)&DAT_0015c868);
  pRVar3 = Enc::fullRange(&poVar2->encoding);
  local_24 = 10;
  poVar2 = realopt_t::operator->((realopt_t *)&DAT_0015c868);
  bVar1 = Enc::encode(&poVar2->encoding,&local_24);
  if (!bVar1) {
    fatalf(this,"Bad code point: \'0x%X\'",(ulong)local_24);
  }
  r2 = Range::sym(local_24);
  pRVar3 = Range::sub(pRVar3,r2);
  pRVar4 = cls(this,pRVar3);
  return pRVar4;
}

Assistant:

RegExp * Scanner::mkDot() const
{
	Range * full = opts->encoding.fullRange();
	uint32_t c = '\n';
	if (!opts->encoding.encode(c))
		fatalf("Bad code point: '0x%X'", c);
	Range * ran = Range::sym (c);
	Range * inv = Range::sub (full, ran);

	return cls(inv);
}